

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

void __thiscall gvr::PLYWriter::~PLYWriter(PLYWriter *this)

{
  PLYElement *pPVar1;
  pointer pPVar2;
  pointer pcVar3;
  long lVar4;
  undefined8 uVar5;
  pointer ppPVar6;
  ulong uVar7;
  pointer this_00;
  
  ppPVar6 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppPVar6) {
    uVar7 = 0;
    do {
      pPVar1 = ppPVar6[uVar7];
      if (pPVar1 != (PLYElement *)0x0) {
        this_00 = (pPVar1->list).
                  super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pPVar2 = (pPVar1->list).
                 super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (this_00 != pPVar2) {
          do {
            anon_unknown_3::PLYProperty::~PLYProperty(this_00);
            this_00 = this_00 + 1;
          } while (this_00 != pPVar2);
          this_00 = (pPVar1->list).
                    super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        if (this_00 != (pointer)0x0) {
          operator_delete(this_00);
        }
        pcVar3 = (pPVar1->name)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != &(pPVar1->name).field_2) {
          operator_delete(pcVar3);
        }
      }
      operator_delete(pPVar1);
      uVar7 = uVar7 + 1;
      ppPVar6 = (this->list).
                super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->list).
                                   super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar6 >> 3))
    ;
  }
  uVar5 = ___throw_bad_array_new_length;
  lVar4 = _VTT;
  *(long *)&this->out = _VTT;
  *(undefined8 *)(&this->out + *(long *)(lVar4 + -0x18)) = uVar5;
  std::filebuf::~filebuf((filebuf *)&this->field_0x50);
  std::ios_base::~ios_base((ios_base *)&this->field_0x140);
  ppPVar6 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppPVar6 != (pointer)0x0) {
    operator_delete(ppPVar6);
    return;
  }
  return;
}

Assistant:

PLYWriter::~PLYWriter()
{
  for (size_t i=0; i<list.size(); i++)
  {
    delete list[i];
  }
}